

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_http_auth_act(connectdata *conn)

{
  Curl_HttpReq CVar1;
  Curl_easy *data;
  bool bVar2;
  _Bool _Var3;
  CURLcode CVar4;
  int iVar5;
  char *pcVar6;
  
  data = conn->data;
  iVar5 = (data->req).httpcode;
  if (iVar5 - 100U < 100) {
LAB_00110d2d:
    CVar4 = CURLE_OK;
  }
  else {
    if ((data->state).authproblem == true) {
      if ((data->set).http_fail_on_error != false) {
        return CURLE_HTTP_RETURNED_ERROR;
      }
      return CURLE_OK;
    }
    if ((conn->bits).user_passwd == true) {
      if (iVar5 == 0x191) {
LAB_00110d77:
        _Var3 = pickoneauth(&(data->state).authhost);
        bVar2 = true;
        if (!_Var3) {
          (data->state).authproblem = true;
          goto LAB_00110d91;
        }
      }
      else {
        bVar2 = false;
        if ((iVar5 < 300) && (bVar2 = false, (conn->bits).authneg != false)) goto LAB_00110d77;
      }
    }
    else {
LAB_00110d91:
      bVar2 = false;
    }
    if (((conn->bits).proxy_user_passwd == true) &&
       ((iVar5 = (data->req).httpcode, iVar5 == 0x197 ||
        ((iVar5 < 300 && ((conn->bits).authneg != false)))))) {
      _Var3 = pickoneauth(&(data->state).authproxy);
      if (!_Var3) {
        (data->state).authproblem = true;
        goto LAB_00110de6;
      }
      _Var3 = true;
      if (bVar2) {
        Curl_http_input_auth_init_ctx(conn,false);
      }
LAB_00110dee:
      Curl_http_input_auth_init_ctx(conn,_Var3);
      (*Curl_cfree)((data->req).newurl);
      (data->req).newurl = (char *)0x0;
      pcVar6 = (*Curl_cstrdup)((data->change).url);
      (data->req).newurl = pcVar6;
      if (pcVar6 != (char *)0x0) {
        CVar1 = (data->set).httpreq;
        if (((CVar1 != HTTPREQ_GET) && (CVar1 != HTTPREQ_HEAD)) &&
           (((conn->bits).rewindaftersend == false &&
            (CVar4 = http_perhapsrewind(conn), CVar4 != CURLE_OK)))) {
          return CVar4;
        }
LAB_00110eb0:
        iVar5 = http_should_fail(conn);
        if (iVar5 != 0) {
          Curl_failf(data,"The requested URL returned error: %d",(ulong)(uint)(data->req).httpcode);
          return CURLE_HTTP_RETURNED_ERROR;
        }
        goto LAB_00110d2d;
      }
    }
    else {
LAB_00110de6:
      if (bVar2) {
        _Var3 = false;
        goto LAB_00110dee;
      }
      if ((((299 < (data->req).httpcode) || ((data->state).authhost.done != false)) ||
          ((conn->bits).authneg != true)) ||
         ((CVar1 = (data->set).httpreq, CVar1 == HTTPREQ_GET || (CVar1 == HTTPREQ_HEAD))))
      goto LAB_00110eb0;
      pcVar6 = (*Curl_cstrdup)((data->change).url);
      (data->req).newurl = pcVar6;
      if (pcVar6 != (char *)0x0) {
        (data->state).authhost.done = true;
        goto LAB_00110eb0;
      }
    }
    CVar4 = CURLE_OUT_OF_MEMORY;
  }
  return CVar4;
}

Assistant:

CURLcode Curl_http_auth_act(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  bool pickhost = FALSE;
  bool pickproxy = FALSE;
  CURLcode result = CURLE_OK;

  if(100 <= data->req.httpcode && 199 >= data->req.httpcode)
    /* this is a transient response code, ignore */
    return CURLE_OK;

  if(data->state.authproblem)
    return data->set.http_fail_on_error?CURLE_HTTP_RETURNED_ERROR:CURLE_OK;

  if(conn->bits.user_passwd &&
     ((data->req.httpcode == 401) ||
      (conn->bits.authneg && data->req.httpcode < 300))) {
    pickhost = pickoneauth(&data->state.authhost);
    if(!pickhost)
      data->state.authproblem = TRUE;
  }
  if(conn->bits.proxy_user_passwd &&
     ((data->req.httpcode == 407) ||
      (conn->bits.authneg && data->req.httpcode < 300))) {
    pickproxy = pickoneauth(&data->state.authproxy);
    if(!pickproxy)
      data->state.authproblem = TRUE;
  }

  if(pickhost || pickproxy) {
    if(pickhost)
      Curl_http_input_auth_init_ctx(conn, false);
    if(pickproxy)
      Curl_http_input_auth_init_ctx(conn, true);

    /* In case this is GSS auth, the newurl field is already allocated so
       we must make sure to free it before allocating a new one. As figured
       out in bug #2284386 */
    Curl_safefree(data->req.newurl);
    data->req.newurl = strdup(data->change.url); /* clone URL */
    if(!data->req.newurl)
      return CURLE_OUT_OF_MEMORY;

    if((data->set.httpreq != HTTPREQ_GET) &&
       (data->set.httpreq != HTTPREQ_HEAD) &&
       !conn->bits.rewindaftersend) {
      result = http_perhapsrewind(conn);
      if(result)
        return result;
    }
  }
  else if((data->req.httpcode < 300) &&
          (!data->state.authhost.done) &&
          conn->bits.authneg) {
    /* no (known) authentication available,
       authentication is not "done" yet and
       no authentication seems to be required and
       we didn't try HEAD or GET */
    if((data->set.httpreq != HTTPREQ_GET) &&
       (data->set.httpreq != HTTPREQ_HEAD)) {
      data->req.newurl = strdup(data->change.url); /* clone URL */
      if(!data->req.newurl)
        return CURLE_OUT_OF_MEMORY;
      data->state.authhost.done = TRUE;
    }
  }
  if(http_should_fail(conn)) {
    failf(data, "The requested URL returned error: %d",
          data->req.httpcode);
    result = CURLE_HTTP_RETURNED_ERROR;
  }

  return result;
}